

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O1

Float<unsigned_int,_5,_5,_15,_2U>
tcu::Float<unsigned_int,5,5,15,2u>::convert<unsigned_int,8,23,127,3u>
          (Float<unsigned_int,_8,_23,_127,_3U> *other)

{
  uint uVar1;
  long lVar2;
  StorageType SVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  
  uVar4 = other->m_value;
  if ((int)uVar4 < 0) {
    return (Float<unsigned_int,_5,_5,_15,_2U>)0;
  }
  SVar3 = 0x3e0;
  if (uVar4 != 0x7f800000) {
    uVar6 = uVar4 & 0x7f800000;
    uVar5 = uVar4 & 0x7fffff;
    SVar3 = 0x3ff;
    if (uVar6 != 0x7f800000 || uVar5 == 0) {
      if (uVar4 == 0) {
        return (Float<unsigned_int,_5,_5,_15,_2U>)0;
      }
      uVar9 = (uVar4 >> 0x17) - 0x7f;
      uVar1 = uVar5 + 0x800000;
      if (uVar6 == 0 && uVar5 != 0) {
        uVar1 = uVar5;
        uVar9 = 0xffffff82;
      }
      uVar8 = (ulong)uVar1;
      if (uVar6 == 0 && uVar5 != 0) {
        lVar2 = 0x3f;
        if ((uVar1 & 0x7fffff) != 0) {
          for (; (uVar1 & 0x7fffff) >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        uVar8 = uVar8 << (~(byte)lVar2 + 0x18 & 0x3f);
        uVar9 = (uVar9 | 0x28) - ((uint)lVar2 ^ 0x3f);
      }
      if (-0xf < (int)uVar9) {
        uVar8 = (uVar8 & 0xffffffffff7fffff) + 0x1ffff + (ulong)(((uint)uVar8 >> 0x12 & 1) != 0);
        iVar7 = uVar9 + (((uint)uVar8 & 0x800000) >> 0x17);
        if (iVar7 < 0x10) {
          uVar4 = (uint)(uVar8 >> 0x12);
          if ((uVar8 & 0x800000) != 0) {
            uVar4 = 0;
          }
          return (Float<unsigned_int,_5,_5,_15,_2U>)(uVar4 | iVar7 * 0x20 + 0x1e0U);
        }
        return (Float<unsigned_int,_5,_5,_15,_2U>)(uVar4 >> 0x15 & 0x400 | 0x3e0);
      }
      SVar3 = 0;
      if (-0x15 < (int)uVar9) {
        SVar3 = (StorageType)
                (~(-1L << (3U - (char)uVar9 & 0x3f)) + uVar8 +
                 (ulong)((uVar8 >> ((ulong)(4 - uVar9) & 0x3f) & 1) != 0) >>
                ((byte)(4 - uVar9) & 0x3f));
      }
    }
  }
  return (Float<unsigned_int,_5,_5,_15,_2U>)SVar3;
}

Assistant:

inline int				signBit			(void) const	{ return (int)(m_value >> (ExponentBits+MantissaBits)) & 1;					}